

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManAnalyzeCoDrivers(Gia_Man_t *p,int *pnDrivers,int *pnInverts)

{
  uint *puVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  void *__s;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  iVar8 = p->nObjs;
  iVar5 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar5 = iVar8;
  }
  if ((iVar5 == 0) || (__s = malloc((long)iVar5 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar8 * 4);
  }
  pVVar3 = p->vCos;
  if (pVVar3->nSize < 1) {
LAB_00764b69:
    if (0 < iVar8) goto LAB_00764b6e;
    iVar8 = 0;
    iVar7 = 0;
    iVar10 = 0;
    iVar5 = 0;
    if (__s == (void *)0x0) goto LAB_00764b9d;
  }
  else {
    piVar4 = pVVar3->pArray;
    lVar6 = 0;
    do {
      iVar5 = piVar4[lVar6];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00764b69;
      uVar2 = *(uint *)(p->pObjs + iVar5);
      uVar9 = iVar5 - (uVar2 & 0x1fffffff);
      if (((int)uVar9 < 0) || (iVar8 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)uVar9 * 4);
      *puVar1 = *puVar1 | ((uVar2 >> 0x1d & 1) != 0) + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
LAB_00764b6e:
    lVar6 = 0;
    iVar7 = 0;
    iVar10 = 0;
    do {
      iVar5 = *(int *)((long)__s + lVar6 * 4);
      iVar10 = (iVar10 + 1) - (uint)(iVar5 == 0);
      iVar7 = iVar7 + (uint)(iVar5 == 3);
      lVar6 = lVar6 + 1;
    } while (iVar8 != lVar6);
  }
  free(__s);
  iVar8 = iVar7;
  iVar5 = iVar10;
LAB_00764b9d:
  *pnDrivers = iVar5;
  *pnInverts = iVar8;
  return;
}

Assistant:

void Lf_ManAnalyzeCoDrivers( Gia_Man_t * p, int * pnDrivers, int * pnInverts )
{
    Gia_Obj_t * pObj;
    int i, Entry, nDrivers, nInverts;
    Vec_Int_t * vMarks = Vec_IntStart( Gia_ManObjNum(p) );
    nDrivers = nInverts = 0;
    Gia_ManForEachCo( p, pObj, i )
        *Vec_IntEntryP( vMarks, Gia_ObjFaninId0p(p, pObj) ) |= Gia_ObjFaninC0(pObj) ? 2 : 1;
    Vec_IntForEachEntry( vMarks, Entry, i )
        nDrivers += (int)(Entry != 0), nInverts += (int)(Entry == 3);
    Vec_IntFree( vMarks );
    *pnDrivers = nDrivers;
    *pnInverts = nInverts;
}